

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O3

trex * __thiscall
fmp4_stream::init_fragment::get_trex(trex *__return_storage_ptr__,init_fragment *this)

{
  uint uVar1;
  pointer puVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  bool bVar25;
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  uint uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  puVar2 = (this->moov_box_).box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(this->moov_box_).box_data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2)) {
    uVar29 = 8;
    uVar30 = 8;
    do {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"trak","");
      if ((((puVar2[uVar30 + 4] != (uchar)*local_50[0]) ||
           (puVar2[uVar30 + 5] != *(uchar *)((long)local_50[0] + 1))) ||
          (puVar2[uVar30 + 6] != *(uchar *)((long)local_50[0] + 2))) ||
         (bVar25 = true, puVar2[uVar30 + 7] != *(uchar *)((long)local_50[0] + 3))) {
        bVar25 = false;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (bVar25) {
        uVar30 = (ulong)(uVar29 + 8);
        if (uVar30 < (ulong)((long)(this->moov_box_).box_data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->moov_box_).box_data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) {
          goto LAB_0010e333;
        }
        break;
      }
      uVar1 = *(uint *)(puVar2 + uVar30);
      uVar29 = (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) +
               uVar29;
      uVar30 = (ulong)uVar29;
    } while (uVar30 < (ulong)((long)(this->moov_box_).box_data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->moov_box_).box_data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start));
  }
  goto LAB_0010e46a;
  while( true ) {
    uVar29 = *(uint *)(puVar2 + uVar30);
    uVar30 = (ulong)((uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 |
                     uVar29 << 0x18) + (int)uVar30);
    if ((ulong)((long)(this->moov_box_).box_data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->moov_box_).box_data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) <= uVar30) break;
LAB_0010e333:
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"mvex","");
    if (((puVar2[uVar30 + 4] != (uchar)*local_70[0]) ||
        (puVar2[uVar30 + 5] != *(uchar *)((long)local_70[0] + 1))) ||
       ((puVar2[uVar30 + 6] != *(uchar *)((long)local_70[0] + 2) ||
        (bVar25 = true, puVar2[uVar30 + 7] != *(uchar *)((long)local_70[0] + 3))))) {
      bVar25 = false;
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (bVar25) {
      uVar29 = (int)uVar30 + 8;
      uVar30 = (ulong)uVar29;
      if (uVar30 < (ulong)((long)(this->moov_box_).box_data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->moov_box_).box_data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start)) {
        do {
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"trex","");
          if (((puVar2[uVar30 + 4] != (uchar)*local_90[0]) ||
              (puVar2[uVar30 + 5] != *(uchar *)((long)local_90[0] + 1))) ||
             ((puVar2[uVar30 + 6] != *(uchar *)((long)local_90[0] + 2) ||
              (bVar25 = true, puVar2[uVar30 + 7] != *(uchar *)((long)local_90[0] + 3))))) {
            bVar25 = false;
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          if (bVar25) {
            auVar31 = *(undefined1 (*) [16])(puVar2 + (ulong)uVar29 + 0xc);
            auVar33[1] = 0;
            auVar33[0] = auVar31[8];
            auVar33[2] = auVar31[9];
            auVar33[3] = 0;
            auVar33[4] = auVar31[10];
            auVar33[5] = 0;
            auVar33[6] = auVar31[0xb];
            auVar33[7] = 0;
            auVar33[8] = auVar31[0xc];
            auVar33[9] = 0;
            auVar33[10] = auVar31[0xd];
            auVar33[0xb] = 0;
            auVar33[0xc] = auVar31[0xe];
            auVar33[0xd] = 0;
            auVar33[0xe] = auVar31[0xf];
            auVar33[0xf] = 0;
            auVar32 = pshuflw(auVar33,auVar33,0x1b);
            auVar33 = pshufhw(auVar32,auVar32,0x1b);
            auVar19[0xd] = 0;
            auVar19._0_13_ = auVar31._0_13_;
            auVar19[0xe] = auVar31[7];
            auVar20[0xc] = auVar31[6];
            auVar20._0_12_ = auVar31._0_12_;
            auVar20._13_2_ = auVar19._13_2_;
            auVar21[0xb] = 0;
            auVar21._0_11_ = auVar31._0_11_;
            auVar21._12_3_ = auVar20._12_3_;
            auVar22[10] = auVar31[5];
            auVar22._0_10_ = auVar31._0_10_;
            auVar22._11_4_ = auVar21._11_4_;
            auVar23[9] = 0;
            auVar23._0_9_ = auVar31._0_9_;
            auVar23._10_5_ = auVar22._10_5_;
            auVar24[8] = auVar31[4];
            auVar24._0_8_ = auVar31._0_8_;
            auVar24._9_6_ = auVar23._9_6_;
            auVar26._7_8_ = 0;
            auVar26._0_7_ = auVar24._8_7_;
            auVar27._1_8_ = SUB158(auVar26 << 0x40,7);
            auVar27[0] = auVar31[3];
            auVar27._9_6_ = 0;
            auVar28._1_10_ = SUB1510(auVar27 << 0x30,5);
            auVar28[0] = auVar31[2];
            auVar28._11_4_ = 0;
            auVar32._3_12_ = SUB1512(auVar28 << 0x20,3);
            auVar32[2] = auVar31[1];
            auVar32[0] = auVar31[0];
            auVar32[1] = 0;
            auVar32[0xf] = 0;
            auVar31 = pshuflw(auVar32,auVar32,0x1b);
            auVar31 = pshufhw(auVar31,auVar31,0x1b);
            sVar3 = auVar31._0_2_;
            sVar4 = auVar31._2_2_;
            sVar5 = auVar31._4_2_;
            sVar6 = auVar31._6_2_;
            sVar7 = auVar31._8_2_;
            sVar8 = auVar31._10_2_;
            sVar9 = auVar31._12_2_;
            sVar10 = auVar31._14_2_;
            sVar11 = auVar33._0_2_;
            sVar12 = auVar33._2_2_;
            sVar13 = auVar33._4_2_;
            sVar14 = auVar33._6_2_;
            sVar15 = auVar33._8_2_;
            sVar16 = auVar33._10_2_;
            sVar17 = auVar33._12_2_;
            sVar18 = auVar33._14_2_;
            *(char *)&__return_storage_ptr__->track_id_ =
                 (0 < sVar3) * (sVar3 < 0x100) * auVar31[0] - (0xff < sVar3);
            *(char *)((long)&__return_storage_ptr__->track_id_ + 1) =
                 (0 < sVar4) * (sVar4 < 0x100) * auVar31[2] - (0xff < sVar4);
            *(char *)((long)&__return_storage_ptr__->track_id_ + 2) =
                 (0 < sVar5) * (sVar5 < 0x100) * auVar31[4] - (0xff < sVar5);
            *(char *)((long)&__return_storage_ptr__->track_id_ + 3) =
                 (0 < sVar6) * (sVar6 < 0x100) * auVar31[6] - (0xff < sVar6);
            *(char *)&__return_storage_ptr__->default_sample_description_index_ =
                 (0 < sVar7) * (sVar7 < 0x100) * auVar31[8] - (0xff < sVar7);
            *(char *)((long)&__return_storage_ptr__->default_sample_description_index_ + 1) =
                 (0 < sVar8) * (sVar8 < 0x100) * auVar31[10] - (0xff < sVar8);
            *(char *)((long)&__return_storage_ptr__->default_sample_description_index_ + 2) =
                 (0 < sVar9) * (sVar9 < 0x100) * auVar31[0xc] - (0xff < sVar9);
            *(char *)((long)&__return_storage_ptr__->default_sample_description_index_ + 3) =
                 (0 < sVar10) * (sVar10 < 0x100) * auVar31[0xe] - (0xff < sVar10);
            *(char *)&__return_storage_ptr__->default_sample_duration_ =
                 (0 < sVar11) * (sVar11 < 0x100) * auVar33[0] - (0xff < sVar11);
            *(char *)((long)&__return_storage_ptr__->default_sample_duration_ + 1) =
                 (0 < sVar12) * (sVar12 < 0x100) * auVar33[2] - (0xff < sVar12);
            *(char *)((long)&__return_storage_ptr__->default_sample_duration_ + 2) =
                 (0 < sVar13) * (sVar13 < 0x100) * auVar33[4] - (0xff < sVar13);
            *(char *)((long)&__return_storage_ptr__->default_sample_duration_ + 3) =
                 (0 < sVar14) * (sVar14 < 0x100) * auVar33[6] - (0xff < sVar14);
            *(char *)&__return_storage_ptr__->default_sample_size_ =
                 (0 < sVar15) * (sVar15 < 0x100) * auVar33[8] - (0xff < sVar15);
            *(char *)((long)&__return_storage_ptr__->default_sample_size_ + 1) =
                 (0 < sVar16) * (sVar16 < 0x100) * auVar33[10] - (0xff < sVar16);
            *(char *)((long)&__return_storage_ptr__->default_sample_size_ + 2) =
                 (0 < sVar17) * (sVar17 < 0x100) * auVar33[0xc] - (0xff < sVar17);
            *(char *)((long)&__return_storage_ptr__->default_sample_size_ + 3) =
                 (0 < sVar18) * (sVar18 < 0x100) * auVar33[0xe] - (0xff < sVar18);
            uVar29 = *(uint *)(puVar2 + (ulong)uVar29 + 0x1c);
            __return_storage_ptr__->default_sample_flags_ =
                 uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 | uVar29 << 0x18
            ;
            return __return_storage_ptr__;
          }
          uVar1 = *(uint *)(puVar2 + uVar30);
          uVar29 = (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
                   + uVar29;
          uVar30 = (ulong)uVar29;
        } while (uVar30 < (ulong)((long)(this->moov_box_).box_data_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->moov_box_).box_data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start));
      }
      break;
    }
  }
LAB_0010e46a:
  __return_storage_ptr__->track_id_ = 0;
  __return_storage_ptr__->default_sample_description_index_ = 0;
  __return_storage_ptr__->default_sample_duration_ = 0;
  __return_storage_ptr__->default_sample_size_ = 0;
  __return_storage_ptr__->default_sample_flags_ = 0;
  return __return_storage_ptr__;
}

Assistant:

trex init_fragment::get_trex()
	{
		char* ptr = (char*)moov_box_.box_data_.data();
		bool trak_found = false;
		bool mvex_found = false;
		bool trex_found = false;


		uint32_t pos = 8;

		// find trak box 
		while (!trak_found && pos < moov_box_.box_data_.size())
		{
			if (f_compare_4cc(ptr + 4 + pos, "trak"))
				trak_found = true;
			else
				pos += fmp4_read_uint32(ptr + pos);
		}
		if (trak_found)
		{
			pos += 8;
			while (!mvex_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "mvex"))
					mvex_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (mvex_found)
		{
			pos += 8;
			while (!trex_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "trex"))
					trex_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (trex_found)
		{
			trex t = {}; 
			// uint32_t track_id_;
			// uint32_t default_sample_description_index_;
			// uint32_t default_sample_duration_;
			// uint32_t default_sample_size_;
			// uint32_t default_sample_flags_;
			t.track_id_ = fmp4_read_uint32(ptr + pos + 12);
			t.default_sample_description_index_ = fmp4_read_uint32(ptr + pos + 16);
			t.default_sample_duration_ = fmp4_read_uint32(ptr + pos + 20);
			t.default_sample_size_ = fmp4_read_uint32(ptr + pos + 24);
			t.default_sample_flags_ = fmp4_read_uint32(ptr + pos + 28);
			
			return t;
		}
		trex t = {};
		
		return t;

	}